

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.h
# Opt level: O2

bool __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::Equals(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
         *this,ISourceHolder *other)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  LPCUTF8 puVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar4;
  
  bVar4 = true;
  if (this != (JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
               *)other) {
    sVar2 = GetByteLength(this,L"Equal Comparison");
    iVar1 = (*(other->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(other,L"Equal Comparison");
    if (sVar2 == CONCAT44(extraout_var,iVar1)) {
      puVar3 = GetSource(this,L"Equal Comparison");
      iVar1 = (*(other->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[6])(other,L"Equal Comparison");
      if (puVar3 != (LPCUTF8)CONCAT44(extraout_var_00,iVar1)) {
        puVar3 = GetSource(this,L"Equal Comparison");
        iVar1 = (*(other->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(other,L"Equal Comparison");
        sVar2 = GetByteLength(this,L"Equal Comparison");
        iVar1 = bcmp(puVar3,(void *)CONCAT44(extraout_var_01,iVar1),sVar2);
        bVar4 = iVar1 == 0;
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

virtual bool Equals(ISourceHolder* other) override
        {
            return this == other ||
                (this->GetByteLength(_u("Equal Comparison")) == other->GetByteLength(_u("Equal Comparison"))
                    && (this->GetSource(_u("Equal Comparison")) == other->GetSource(_u("Equal Comparison"))
                        || memcmp(this->GetSource(_u("Equal Comparison")), other->GetSource(_u("Equal Comparison")), this->GetByteLength(_u("Equal Comparison"))) == 0));
        }